

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1a982c5::Scenario::ReceivedInv
          (Scenario *this,NodeId peer,GenTxid *gtxid,bool pref,microseconds reqtime)

{
  pointer *pppVar1;
  undefined8 *puVar2;
  _Manager_type *pp_Var3;
  uchar uVar4;
  long lVar5;
  Runner *pRVar6;
  pointer ppVar7;
  pointer ppVar8;
  _Manager_type p_Var9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined8 uVar16;
  long lVar17;
  long lVar18;
  undefined8 uVar19;
  long *plVar20;
  size_type __n;
  long lVar21;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar22;
  pointer ppVar23;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__cur;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar24;
  pointer ppVar25;
  long in_FS_OFFSET;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined3 uVar12;
  undefined2 uVar14;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar6 = this->m_runner;
  uVar4 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[0x1f];
  uVar19._0_1_ = gtxid->m_is_wtxid;
  uVar19._1_1_ = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[0];
  uVar19._2_1_ = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[1];
  uVar19._3_1_ = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[2];
  uVar10 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[3];
  uVar11 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[4];
  uVar13 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[5];
  uVar15 = (gtxid->m_hash).super_base_blob<256U>.m_data._M_elems[6];
  uVar14 = CONCAT11(uVar15,uVar13);
  uVar12 = CONCAT21(uVar14,uVar11);
  uVar19._4_4_ = CONCAT31(uVar12,uVar10);
  uVar16 = *(undefined8 *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 7);
  lVar17 = *(long *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0xf);
  lVar18 = *(long *)((gtxid->m_hash).super_base_blob<256U>.m_data._M_elems + 0x17);
  ppVar25 = (pRVar6->actions).
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = (undefined4)uVar19;
  uStack_60 = (undefined4)uVar16;
  uStack_5c = (undefined4)((ulong)uVar16 >> 0x20);
  if (ppVar25 ==
      (pRVar6->actions).
      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(&pRVar6->actions,1,"vector::_M_realloc_insert");
    ppVar7 = (pRVar6->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar8 = (pRVar6->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar21 = (long)ppVar25 - (long)ppVar7 >> 3;
    if (__n == 0) {
      ppVar22 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                 *)0x0;
    }
    else {
      ppVar22 = __gnu_cxx::
                new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                            *)&pRVar6->actions,__n,(void *)0x0);
    }
    (&ppVar22->first)[lVar21].__r = (this->m_now).__r;
    puVar2 = (undefined8 *)((long)&(ppVar22->second).super__Function_base._M_functor + lVar21 * 8);
    *puVar2 = 0;
    puVar2[1] = 0;
    pp_Var3 = &(ppVar22->second).super__Function_base._M_manager + lVar21;
    *pp_Var3 = (_Manager_type)0x0;
    pp_Var3[1] = (_Manager_type)0x0;
    plVar20 = (long *)operator_new(0x40);
    *plVar20 = (long)pRVar6;
    plVar20[1] = peer;
    *(undefined4 *)(plVar20 + 2) = local_68;
    *(undefined4 *)((long)plVar20 + 0x14) = uVar19._4_4_;
    *(undefined4 *)(plVar20 + 3) = uStack_60;
    *(undefined4 *)((long)plVar20 + 0x1c) = uStack_5c;
    plVar20[4] = lVar17;
    plVar20[5] = lVar18;
    *(uchar *)(plVar20 + 6) = uVar4;
    *(bool *)((long)plVar20 + 0x31) = pref;
    plVar20[7] = reqtime.__r;
    *(long **)((long)&(ppVar22->second).super__Function_base._M_functor + lVar21 * 8) = plVar20;
    (&(ppVar22->second)._M_invoker)[lVar21] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
         ::_M_invoke;
    (&(ppVar22->second).super__Function_base._M_manager)[lVar21] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
         ::_M_manager;
    ppVar24 = ppVar22;
    for (ppVar23 = ppVar7; ppVar23 != ppVar25; ppVar23 = ppVar23 + 1) {
      (ppVar24->first).__r = (ppVar23->first).__r;
      *(undefined8 *)&(ppVar24->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar24->second).super__Function_base._M_functor + 8) = 0;
      (ppVar24->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar24->second)._M_invoker = (ppVar23->second)._M_invoker;
      p_Var9 = (ppVar23->second).super__Function_base._M_manager;
      if (p_Var9 != (_Manager_type)0x0) {
        uVar19 = *(undefined8 *)((long)&(ppVar23->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar24->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar23->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar24->second).super__Function_base._M_functor + 8) = uVar19;
        (ppVar24->second).super__Function_base._M_manager = p_Var9;
        (ppVar23->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar23->second)._M_invoker = (_Invoker_type)0x0;
      }
      ppVar24 = ppVar24 + 1;
    }
    for (; ppVar24 = ppVar24 + 1, ppVar8 != ppVar25; ppVar25 = ppVar25 + 1) {
      (ppVar24->first).__r = (ppVar25->first).__r;
      *(undefined8 *)&(ppVar24->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar24->second).super__Function_base._M_functor + 8) = 0;
      (ppVar24->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar24->second)._M_invoker = (ppVar25->second)._M_invoker;
      p_Var9 = (ppVar25->second).super__Function_base._M_manager;
      if (p_Var9 != (_Manager_type)0x0) {
        uVar19 = *(undefined8 *)((long)&(ppVar25->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar24->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar25->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar24->second).super__Function_base._M_functor + 8) = uVar19;
        (ppVar24->second).super__Function_base._M_manager = p_Var9;
        (ppVar25->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar25->second)._M_invoker = (_Invoker_type)0x0;
      }
    }
    if (ppVar7 != (pointer)0x0) {
      operator_delete(ppVar7,(long)(pRVar6->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar7
                     );
    }
    (pRVar6->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar22;
    (pRVar6->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar24;
    (pRVar6->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar22 + __n;
  }
  else {
    (ppVar25->first).__r = (this->m_now).__r;
    *(undefined8 *)&(ppVar25->second).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(ppVar25->second).super__Function_base._M_functor + 8) = 0;
    (ppVar25->second).super__Function_base._M_manager = (_Manager_type)0x0;
    (ppVar25->second)._M_invoker = (_Invoker_type)0x0;
    plVar20 = (long *)operator_new(0x40);
    *plVar20 = (long)pRVar6;
    plVar20[1] = peer;
    *(undefined4 *)(plVar20 + 2) = local_68;
    *(undefined4 *)((long)plVar20 + 0x14) = uVar19._4_4_;
    *(undefined4 *)(plVar20 + 3) = uStack_60;
    *(undefined4 *)((long)plVar20 + 0x1c) = uStack_5c;
    plVar20[4] = lVar17;
    plVar20[5] = lVar18;
    *(uchar *)(plVar20 + 6) = uVar4;
    *(bool *)((long)plVar20 + 0x31) = pref;
    plVar20[7] = reqtime.__r;
    *(long **)&(ppVar25->second).super__Function_base._M_functor = plVar20;
    (ppVar25->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
         ::_M_invoke;
    (ppVar25->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:116:44)>
         ::_M_manager;
    pppVar1 = &(pRVar6->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ReceivedInv(NodeId peer, const GenTxid& gtxid, bool pref, std::chrono::microseconds reqtime)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.ReceivedInv(peer, gtxid, pref, reqtime);
            runner.txrequest.SanityCheck();
        });
    }